

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_DataBlobSourceCreate
          (hrgls_DataBlobSource *returnStream,hrgls_DataBlobSourceCreateParams params)

{
  API *api;
  StreamProperties *props;
  hrgls_API this;
  DataBlobSource *this_00;
  string local_68 [32];
  StreamProperties *local_48;
  StreamProperties *prop;
  hrgls_API local_30;
  hrgls_DataBlobSource ret;
  hrgls_DataBlobSourceCreateParams phStack_20;
  hrgls_Status s;
  hrgls_DataBlobSourceCreateParams params_local;
  hrgls_DataBlobSource *returnStream_local;
  
  if (((returnStream == (hrgls_DataBlobSource *)0x0) ||
      (params == (hrgls_DataBlobSourceCreateParams)0x0)) || (params->api == (hrgls_API)0x0)) {
    returnStream_local._4_4_ = 0x3e9;
  }
  else {
    ret._4_4_ = 0;
    phStack_20 = params;
    params_local = (hrgls_DataBlobSourceCreateParams)returnStream;
    this = (hrgls_API)operator_new(0x38);
    hrgls_DataBlobSource_::hrgls_DataBlobSource_((hrgls_DataBlobSource_ *)this);
    local_48 = (StreamProperties *)0x0;
    if (phStack_20->streamProperties != (hrgls_StreamProperties)0x0) {
      local_48 = phStack_20->streamProperties->props;
    }
    local_30 = this;
    this_00 = (DataBlobSource *)operator_new(8);
    props = local_48;
    api = phStack_20->api->api;
    std::__cxx11::string::string(local_68,(string *)&phStack_20->name);
    hrgls::datablob::DataBlobSource::DataBlobSource(this_00,api,props,(string *)local_68);
    local_30->api = (API *)this_00;
    std::__cxx11::string::~string(local_68);
    params_local->api = local_30;
    returnStream_local._4_4_ =
         hrgls::datablob::DataBlobSource::GetStatus((DataBlobSource *)local_30->api);
  }
  return returnStream_local._4_4_;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreate(hrgls_DataBlobSource *returnStream,
    hrgls_DataBlobSourceCreateParams params)
  {
    hrgls_Status s;

    // Check the parameters.
    if (!returnStream || !params || !params->api) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    // Attempt to construct the object.
    s = hrgls_STATUS_OKAY;
    hrgls_DataBlobSource ret;
    try {
      ret = new hrgls_DataBlobSource_;
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret = nullptr;
    }
    try {
      // Get the C++ parameters out of the C structure pointers.
      hrgls::StreamProperties *prop = nullptr;
      if (params->streamProperties) { prop = params->streamProperties->props; }
      ret->stream = new hrgls::datablob::DataBlobSource(*params->api->api, *prop,
        params->name);
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret->stream = nullptr;
      delete ret;
      ret = nullptr;
    }
    *returnStream = ret;
    return ret->stream->GetStatus();
  }